

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_best_bst.cpp
# Opt level: O2

int main(void)

{
  map_bst<int,_int,_std::less<int>_> bst;
  int k;
  
  std::istream::operator>>((istream *)&std::cin,&k);
  bst.mRoot = (node *)0x0;
  bst.mSize = 0;
  gen_best_bst((2 << ((byte)k & 0x1f)) + -1,&bst);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_preorder(&bst);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_inorder(&bst);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_postorder(&bst);
  CP::map_bst<int,_int,_std::less<int>_>::~map_bst(&bst);
  return 0;
}

Assistant:

int main() {
  int k;
  int n;
  std::cin >> k;
  n = (2 << k) - 1;
  CP::map_bst<int,int> bst;
  gen_best_bst(n,bst);
  bst.print_key_preorder();
  bst.print_key_inorder();
  bst.print_key_postorder();
}